

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O3

void pbrt::ConnectToDisplayServer(string *host)

{
  id in_RAX;
  IPCChannel *this;
  thread local_18;
  
  if (channel != (IPCChannel *)0x0) {
    LogFatal<char_const(&)[19]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/display.cpp"
               ,0x1a3,"Check failed: %s",(char (*) [19])"channel == nullptr");
  }
  local_18._M_id._M_thread = (id)(id)in_RAX._M_thread;
  this = (IPCChannel *)operator_new(0x50);
  IPCChannel::IPCChannel(this,host);
  channel = this;
  std::thread::thread<void(&)(),,void>(&local_18,updateDynamicItems);
  if (updateThread._M_thread == 0) {
    updateThread = local_18._M_id._M_thread;
    return;
  }
  std::terminate();
}

Assistant:

void ConnectToDisplayServer(const std::string &host) {
    CHECK(channel == nullptr);
    channel = new IPCChannel(host);

    updateThread = std::thread(updateDynamicItems);
}